

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_file.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::FileGenerator::Generate(FileGenerator *this,Printer *printer)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  pointer pEVar6;
  pointer pMVar7;
  pointer pCVar8;
  pointer pGVar9;
  ServiceDescriptor *pSVar10;
  pointer pSVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  Printer *in_RDI;
  bool bVar12;
  Printer *in_stack_00000078;
  FileGenerator *in_stack_00000080;
  int i_7;
  int method_num;
  int bytecode_estimate;
  int i_6;
  int static_block_bytecode_estimate;
  int i_5;
  unique_ptr<google::protobuf::compiler::java::ServiceGenerator,_std::default_delete<google::protobuf::compiler::java::ServiceGenerator>_>
  generator;
  int i_4;
  int i_3;
  int i_2;
  int i_1;
  int i;
  Printer *in_stack_00000288;
  FileGenerator *in_stack_00000290;
  Printer *in_stack_000002f8;
  EnumLiteGenerator *in_stack_00000300;
  Printer *in_stack_00000608;
  EnumGenerator *in_stack_00000610;
  pointer __p;
  Printer *this_00;
  undefined4 in_stack_fffffffffffffe30;
  undefined4 in_stack_fffffffffffffe34;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe38;
  string *in_stack_fffffffffffffe50;
  int in_stack_fffffffffffffe58;
  uint in_stack_fffffffffffffe5c;
  Printer *in_stack_fffffffffffffe60;
  char *in_stack_fffffffffffffe68;
  undefined4 in_stack_fffffffffffffe70;
  uint in_stack_fffffffffffffe74;
  Context *context;
  undefined1 immutable_api;
  FileDescriptor *pFVar13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_3;
  char (*in_stack_fffffffffffffeb0) [10];
  allocator *in_stack_fffffffffffffeb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar14;
  int local_128;
  undefined4 in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee4;
  undefined4 in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffeec;
  char *in_stack_fffffffffffffef0;
  int in_stack_fffffffffffffef8;
  int in_stack_fffffffffffffefc;
  int *in_stack_ffffffffffffff00;
  int *in_stack_ffffffffffffff08;
  Printer *in_stack_ffffffffffffff10;
  int local_5c;
  int local_58;
  int local_54;
  allocator local_31;
  string local_30 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_10;
  
  local_10 = in_RSI;
  FileDescriptor::name_abi_cxx11_(*(FileDescriptor **)in_RDI);
  io::Printer::Print<char[9],std::__cxx11::string>
            ((Printer *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
             in_stack_fffffffffffffe68,&in_stack_fffffffffffffe60->variable_delimiter_,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
  uVar5 = std::__cxx11::string::empty();
  if ((uVar5 & 1) == 0) {
    io::Printer::Print<char[8],std::__cxx11::string>
              ((Printer *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
               in_stack_fffffffffffffe68,&in_stack_fffffffffffffe60->variable_delimiter_,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
  }
  bVar12 = ((ulong)(in_RDI->line_start_variables_).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage & 0x100000000) == 0;
  pbVar14 = local_10;
  if (bVar12) {
    in_stack_fffffffffffffeb8 = &local_31;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_30,"",in_stack_fffffffffffffeb8);
  }
  else {
    std::operator+(in_stack_fffffffffffffe38,
                   (char *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
  }
  PrintGeneratedAnnotation
            (in_stack_fffffffffffffe60,(char)(in_stack_fffffffffffffe5c >> 0x18),
             in_stack_fffffffffffffe50);
  std::__cxx11::string::~string(local_30);
  if (bVar12) {
    std::allocator<char>::~allocator((allocator<char> *)&local_31);
  }
  args_3 = local_10;
  FileDescriptor::options(*(FileDescriptor **)in_RDI);
  FileOptions::deprecated((FileOptions *)0x53090c);
  this_00 = (Printer *)&in_RDI->indent_;
  __p = (pointer)0x76edc5;
  io::Printer::
  Print<char[12],char_const*,char[10],std::__cxx11::string,char[5],std::__cxx11::string>
            (in_RDI,(char *)in_RSI,(char (*) [12])pbVar14,(char **)in_stack_fffffffffffffeb8,
             in_stack_fffffffffffffeb0,args_3,
             (char (*) [5])CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  FileDescriptor::name_abi_cxx11_(*(FileDescriptor **)in_RDI);
  io::Printer::Annotate(this_00,(char *)__p,(string *)0x5309b1);
  io::Printer::Indent((Printer *)0x5309be);
  io::Printer::Print<>
            (in_stack_fffffffffffffe60,
             (char *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
  io::Printer::Indent((Printer *)0x5309df);
  local_54 = 0;
  while (iVar4 = local_54, iVar1 = FileDescriptor::extension_count(*(FileDescriptor **)in_RDI),
        iVar4 < iVar1) {
    std::
    vector<std::unique_ptr<google::protobuf::compiler::java::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::java::ExtensionGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::java::ExtensionGenerator>_>_>_>
    ::operator[]((vector<std::unique_ptr<google::protobuf::compiler::java::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::java::ExtensionGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::java::ExtensionGenerator>_>_>_>
                  *)&(in_RDI->substitutions_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
                 ,(long)local_54);
    pEVar6 = std::
             unique_ptr<google::protobuf::compiler::java::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::java::ExtensionGenerator>_>
             ::operator->((unique_ptr<google::protobuf::compiler::java::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::java::ExtensionGenerator>_>
                           *)0x530a3a);
    (*pEVar6->_vptr_ExtensionGenerator[4])(pEVar6,local_10);
    local_54 = local_54 + 1;
  }
  local_58 = 0;
  while (iVar1 = local_58, iVar2 = FileDescriptor::message_type_count(*(FileDescriptor **)in_RDI),
        iVar1 < iVar2) {
    std::
    vector<std::unique_ptr<google::protobuf::compiler::java::MessageGenerator,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::MessageGenerator,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>_>_>
    ::operator[]((vector<std::unique_ptr<google::protobuf::compiler::java::MessageGenerator,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::MessageGenerator,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>_>_>
                  *)&in_RDI->at_start_of_line_,(long)local_58);
    pMVar7 = std::
             unique_ptr<google::protobuf::compiler::java::MessageGenerator,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>
             ::operator->((unique_ptr<google::protobuf::compiler::java::MessageGenerator,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>
                           *)0x530b0a);
    (*pMVar7->_vptr_MessageGenerator[6])(pMVar7,local_10);
    local_58 = local_58 + 1;
  }
  io::Printer::Outdent((Printer *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70));
  io::Printer::Print<>
            (in_stack_fffffffffffffe60,
             (char *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
  pFVar13 = *(FileDescriptor **)in_RDI;
  pCVar8 = std::
           unique_ptr<google::protobuf::compiler::java::Context,_std::default_delete<google::protobuf::compiler::java::Context>_>
           ::operator->((unique_ptr<google::protobuf::compiler::java::Context,_std::default_delete<google::protobuf::compiler::java::Context>_>
                         *)0x530b6e);
  bVar12 = Context::EnforceLite(pCVar8);
  bVar12 = HasDescriptorMethods(pFVar13,bVar12);
  if (bVar12) {
    io::Printer::Print<>
              (in_stack_fffffffffffffe60,
               (char *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
  }
  bVar12 = MultipleJavaFiles((FileDescriptor *)this_00,SUB81((ulong)__p >> 0x38,0));
  if (!bVar12) {
    local_5c = 0;
    while (iVar2 = local_5c, iVar3 = FileDescriptor::enum_type_count(*(FileDescriptor **)in_RDI),
          iVar2 < iVar3) {
      context = *(Context **)in_RDI;
      pCVar8 = std::
               unique_ptr<google::protobuf::compiler::java::Context,_std::default_delete<google::protobuf::compiler::java::Context>_>
               ::operator->((unique_ptr<google::protobuf::compiler::java::Context,_std::default_delete<google::protobuf::compiler::java::Context>_>
                             *)0x530c1f);
      immutable_api = (undefined1)((uint)iVar2 >> 0x18);
      bVar12 = Context::EnforceLite(pCVar8);
      bVar12 = HasDescriptorMethods((FileDescriptor *)context,bVar12);
      if (bVar12) {
        FileDescriptor::enum_type(*(FileDescriptor **)in_RDI,local_5c);
        in_stack_fffffffffffffe74 = (uint)(byte)in_RDI[1].indent_.field_2._M_local_buf[0];
        std::
        unique_ptr<google::protobuf::compiler::java::Context,_std::default_delete<google::protobuf::compiler::java::Context>_>
        ::get((unique_ptr<google::protobuf::compiler::java::Context,_std::default_delete<google::protobuf::compiler::java::Context>_>
               *)this_00);
        EnumGenerator::EnumGenerator
                  ((EnumGenerator *)CONCAT44(iVar4,iVar1),(EnumDescriptor *)pFVar13,
                   (bool)immutable_api,context);
        EnumGenerator::Generate(in_stack_00000610,in_stack_00000608);
        EnumGenerator::~EnumGenerator((EnumGenerator *)this_00);
      }
      else {
        in_stack_fffffffffffffe60 =
             (Printer *)FileDescriptor::enum_type(*(FileDescriptor **)in_RDI,local_5c);
        in_stack_fffffffffffffe5c = (uint)(byte)in_RDI[1].indent_.field_2._M_local_buf[0];
        std::
        unique_ptr<google::protobuf::compiler::java::Context,_std::default_delete<google::protobuf::compiler::java::Context>_>
        ::get((unique_ptr<google::protobuf::compiler::java::Context,_std::default_delete<google::protobuf::compiler::java::Context>_>
               *)this_00);
        EnumLiteGenerator::EnumLiteGenerator
                  ((EnumLiteGenerator *)CONCAT44(iVar4,iVar1),(EnumDescriptor *)pFVar13,
                   (bool)immutable_api,context);
        EnumLiteGenerator::Generate(in_stack_00000300,in_stack_000002f8);
        EnumLiteGenerator::~EnumLiteGenerator((EnumLiteGenerator *)this_00);
      }
      local_5c = local_5c + 1;
    }
    in_stack_fffffffffffffe58 = 0;
    while (in_stack_fffffffffffffefc = in_stack_fffffffffffffe58,
          iVar4 = FileDescriptor::message_type_count(*(FileDescriptor **)in_RDI),
          in_stack_fffffffffffffe58 < iVar4) {
      std::
      vector<std::unique_ptr<google::protobuf::compiler::java::MessageGenerator,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::MessageGenerator,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>_>_>
      ::operator[]((vector<std::unique_ptr<google::protobuf::compiler::java::MessageGenerator,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::MessageGenerator,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>_>_>
                    *)&in_RDI->at_start_of_line_,(long)in_stack_fffffffffffffefc);
      pMVar7 = std::
               unique_ptr<google::protobuf::compiler::java::MessageGenerator,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>
               ::operator->((unique_ptr<google::protobuf::compiler::java::MessageGenerator,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>
                             *)0x530dff);
      (*pMVar7->_vptr_MessageGenerator[5])(pMVar7,local_10);
      std::
      vector<std::unique_ptr<google::protobuf::compiler::java::MessageGenerator,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::MessageGenerator,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>_>_>
      ::operator[]((vector<std::unique_ptr<google::protobuf::compiler::java::MessageGenerator,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::MessageGenerator,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>_>_>
                    *)&in_RDI->at_start_of_line_,(long)in_stack_fffffffffffffefc);
      pMVar7 = std::
               unique_ptr<google::protobuf::compiler::java::MessageGenerator,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>
               ::operator->((unique_ptr<google::protobuf::compiler::java::MessageGenerator,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>
                             *)0x530e31);
      (*pMVar7->_vptr_MessageGenerator[4])(pMVar7,local_10);
      in_stack_fffffffffffffe58 = in_stack_fffffffffffffefc + 1;
    }
    pCVar8 = std::
             unique_ptr<google::protobuf::compiler::java::Context,_std::default_delete<google::protobuf::compiler::java::Context>_>
             ::operator->((unique_ptr<google::protobuf::compiler::java::Context,_std::default_delete<google::protobuf::compiler::java::Context>_>
                           *)0x530e74);
    Context::EnforceLite(pCVar8);
    bVar12 = HasGenericServices((FileDescriptor *)this_00,SUB81((ulong)__p >> 0x38,0));
    if (bVar12) {
      iVar4 = 0;
      while (in_stack_fffffffffffffef8 = iVar4,
            iVar1 = FileDescriptor::service_count(*(FileDescriptor **)in_RDI), iVar4 < iVar1) {
        pGVar9 = std::
                 unique_ptr<google::protobuf::compiler::java::GeneratorFactory,_std::default_delete<google::protobuf::compiler::java::GeneratorFactory>_>
                 ::operator->((unique_ptr<google::protobuf::compiler::java::GeneratorFactory,_std::default_delete<google::protobuf::compiler::java::GeneratorFactory>_>
                               *)0x530eda);
        pSVar10 = FileDescriptor::service(*(FileDescriptor **)in_RDI,in_stack_fffffffffffffef8);
        (*pGVar9->_vptr_GeneratorFactory[4])(pGVar9,pSVar10);
        std::
        unique_ptr<google::protobuf::compiler::java::ServiceGenerator,std::default_delete<google::protobuf::compiler::java::ServiceGenerator>>
        ::unique_ptr<std::default_delete<google::protobuf::compiler::java::ServiceGenerator>,void>
                  ((unique_ptr<google::protobuf::compiler::java::ServiceGenerator,_std::default_delete<google::protobuf::compiler::java::ServiceGenerator>_>
                    *)this_00,__p);
        pSVar11 = std::
                  unique_ptr<google::protobuf::compiler::java::ServiceGenerator,_std::default_delete<google::protobuf::compiler::java::ServiceGenerator>_>
                  ::operator->((unique_ptr<google::protobuf::compiler::java::ServiceGenerator,_std::default_delete<google::protobuf::compiler::java::ServiceGenerator>_>
                                *)0x530f29);
        (*pSVar11->_vptr_ServiceGenerator[2])(pSVar11,local_10);
        std::
        unique_ptr<google::protobuf::compiler::java::ServiceGenerator,_std::default_delete<google::protobuf::compiler::java::ServiceGenerator>_>
        ::~unique_ptr((unique_ptr<google::protobuf::compiler::java::ServiceGenerator,_std::default_delete<google::protobuf::compiler::java::ServiceGenerator>_>
                       *)this_00);
        iVar4 = in_stack_fffffffffffffef8 + 1;
      }
    }
  }
  iVar4 = 0;
  while (iVar1 = iVar4, iVar2 = FileDescriptor::extension_count(*(FileDescriptor **)in_RDI),
        iVar4 < iVar2) {
    std::
    vector<std::unique_ptr<google::protobuf::compiler::java::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::java::ExtensionGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::java::ExtensionGenerator>_>_>_>
    ::operator[]((vector<std::unique_ptr<google::protobuf::compiler::java::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::java::ExtensionGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::java::ExtensionGenerator>_>_>_>
                  *)&(in_RDI->substitutions_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
                 ,(long)iVar1);
    pEVar6 = std::
             unique_ptr<google::protobuf::compiler::java::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::java::ExtensionGenerator>_>
             ::operator->((unique_ptr<google::protobuf::compiler::java::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::java::ExtensionGenerator>_>
                           *)0x530fdd);
    (*pEVar6->_vptr_ExtensionGenerator[2])(pEVar6,local_10);
    iVar4 = iVar1 + 1;
  }
  iVar4 = 0;
  while (iVar1 = iVar4, iVar2 = FileDescriptor::message_type_count(*(FileDescriptor **)in_RDI),
        iVar4 < iVar2) {
    std::
    vector<std::unique_ptr<google::protobuf::compiler::java::MessageGenerator,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::MessageGenerator,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>_>_>
    ::operator[]((vector<std::unique_ptr<google::protobuf::compiler::java::MessageGenerator,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::MessageGenerator,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>_>_>
                  *)&in_RDI->at_start_of_line_,(long)iVar1);
    pMVar7 = std::
             unique_ptr<google::protobuf::compiler::java::MessageGenerator,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>
             ::operator->((unique_ptr<google::protobuf::compiler::java::MessageGenerator,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>
                           *)0x53105d);
    (*pMVar7->_vptr_MessageGenerator[2])(pMVar7,local_10,&stack0xfffffffffffffee8);
    iVar4 = iVar1 + 1;
  }
  io::Printer::Print<>
            (in_stack_fffffffffffffe60,
             (char *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
  pFVar13 = *(FileDescriptor **)in_RDI;
  pCVar8 = std::
           unique_ptr<google::protobuf::compiler::java::Context,_std::default_delete<google::protobuf::compiler::java::Context>_>
           ::operator->((unique_ptr<google::protobuf::compiler::java::Context,_std::default_delete<google::protobuf::compiler::java::Context>_>
                         *)0x5310b9);
  bVar12 = Context::EnforceLite(pCVar8);
  bVar12 = HasDescriptorMethods(pFVar13,bVar12);
  if (bVar12) {
    if ((in_RDI[1].indent_.field_2._M_local_buf[0] & 1U) == 0) {
      GenerateDescriptorInitializationCodeForMutable(in_stack_00000290,in_stack_00000288);
    }
    else {
      GenerateDescriptorInitializationCodeForImmutable(in_stack_00000080,in_stack_00000078);
    }
  }
  else {
    io::Printer::Print<>
              (in_stack_fffffffffffffe60,
               (char *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
    io::Printer::Indent((Printer *)0x53113a);
    for (local_128 = 0; iVar4 = FileDescriptor::message_type_count(*(FileDescriptor **)in_RDI),
        local_128 < iVar4; local_128 = local_128 + 1) {
      std::
      vector<std::unique_ptr<google::protobuf::compiler::java::MessageGenerator,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::MessageGenerator,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>_>_>
      ::operator[]((vector<std::unique_ptr<google::protobuf::compiler::java::MessageGenerator,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::MessageGenerator,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>_>_>
                    *)&in_RDI->at_start_of_line_,(long)local_128);
      pMVar7 = std::
               unique_ptr<google::protobuf::compiler::java::MessageGenerator,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>
               ::operator->((unique_ptr<google::protobuf::compiler::java::MessageGenerator,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>
                             *)0x5311a5);
      (*pMVar7->_vptr_MessageGenerator[3])(pMVar7,local_10);
      anon_unknown_0::MaybeRestartJavaMethod
                (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
                 (char *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                 in_stack_fffffffffffffef0);
    }
    io::Printer::Outdent((Printer *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70));
    io::Printer::Print<>
              (in_stack_fffffffffffffe60,
               (char *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
  }
  io::Printer::Print<>
            (in_stack_fffffffffffffe60,
             (char *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
  io::Printer::Outdent((Printer *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70));
  io::Printer::Print<>
            (in_stack_fffffffffffffe60,
             (char *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
  return;
}

Assistant:

void FileGenerator::Generate(io::Printer* printer) {
  // We don't import anything because we refer to all classes by their
  // fully-qualified names in the generated source.
  printer->Print(
      "// Generated by the protocol buffer compiler.  DO NOT EDIT!\n"
      "// source: $filename$\n"
      "\n",
      "filename", file_->name());
  if (!java_package_.empty()) {
    printer->Print(
        "package $package$;\n"
        "\n",
        "package", java_package_);
  }
  PrintGeneratedAnnotation(
      printer, '$', options_.annotate_code ? classname_ + ".java.pb.meta" : "");
  printer->Print(
      "$deprecation$public final class $classname$ {\n"
      "  private $ctor$() {}\n",
      "deprecation",
      file_->options().deprecated() ? "@java.lang.Deprecated " : "",
      "classname", classname_, "ctor", classname_);
  printer->Annotate("classname", file_->name());
  printer->Indent();

  // -----------------------------------------------------------------

  printer->Print(
      "public static void registerAllExtensions(\n"
      "    com.google.protobuf.ExtensionRegistryLite registry) {\n");

  printer->Indent();

  for (int i = 0; i < file_->extension_count(); i++) {
    extension_generators_[i]->GenerateRegistrationCode(printer);
  }

  for (int i = 0; i < file_->message_type_count(); i++) {
    message_generators_[i]->GenerateExtensionRegistrationCode(printer);
  }

  printer->Outdent();
  printer->Print("}\n");
  if (HasDescriptorMethods(file_, context_->EnforceLite())) {
    // Overload registerAllExtensions for the non-lite usage to
    // redundantly maintain the original signature (this is
    // redundant because ExtensionRegistryLite now invokes
    // ExtensionRegistry in the non-lite usage). Intent is
    // to remove this in the future.
    printer->Print(
        "\n"
        "public static void registerAllExtensions(\n"
        "    com.google.protobuf.ExtensionRegistry registry) {\n"
        "  registerAllExtensions(\n"
        "      (com.google.protobuf.ExtensionRegistryLite) registry);\n"
        "}\n");
  }

  // -----------------------------------------------------------------

  if (!MultipleJavaFiles(file_, immutable_api_)) {
    for (int i = 0; i < file_->enum_type_count(); i++) {
      if (HasDescriptorMethods(file_, context_->EnforceLite())) {
        EnumGenerator(file_->enum_type(i), immutable_api_, context_.get())
            .Generate(printer);
      } else {
        EnumLiteGenerator(file_->enum_type(i), immutable_api_, context_.get())
            .Generate(printer);
      }
    }
    for (int i = 0; i < file_->message_type_count(); i++) {
      message_generators_[i]->GenerateInterface(printer);
      message_generators_[i]->Generate(printer);
    }
    if (HasGenericServices(file_, context_->EnforceLite())) {
      for (int i = 0; i < file_->service_count(); i++) {
        std::unique_ptr<ServiceGenerator> generator(
            generator_factory_->NewServiceGenerator(file_->service(i)));
        generator->Generate(printer);
      }
    }
  }

  // Extensions must be generated in the outer class since they are values,
  // not classes.
  for (int i = 0; i < file_->extension_count(); i++) {
    extension_generators_[i]->Generate(printer);
  }

  // Static variables. We'd like them to be final if possible, but due to
  // the JVM's 64k size limit on static blocks, we have to initialize some
  // of them in methods; thus they cannot be final.
  int static_block_bytecode_estimate = 0;
  for (int i = 0; i < file_->message_type_count(); i++) {
    message_generators_[i]->GenerateStaticVariables(
        printer, &static_block_bytecode_estimate);
  }

  printer->Print("\n");

  if (HasDescriptorMethods(file_, context_->EnforceLite())) {
    if (immutable_api_) {
      GenerateDescriptorInitializationCodeForImmutable(printer);
    } else {
      GenerateDescriptorInitializationCodeForMutable(printer);
    }
  } else {
    printer->Print("static {\n");
    printer->Indent();
    int bytecode_estimate = 0;
    int method_num = 0;

    for (int i = 0; i < file_->message_type_count(); i++) {
      bytecode_estimate +=
          message_generators_[i]->GenerateStaticVariableInitializers(printer);
      MaybeRestartJavaMethod(
          printer, &bytecode_estimate, &method_num,
          "_clinit_autosplit_$method_num$();\n",
          "private static void _clinit_autosplit_$method_num$() {\n");
    }

    printer->Outdent();
    printer->Print("}\n");
  }

  printer->Print(
      "\n"
      "// @@protoc_insertion_point(outer_class_scope)\n");

  printer->Outdent();
  printer->Print("}\n");
}